

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

UINT GetTempFileNameA(LPCSTR lpPathName,LPCSTR lpPrefixString,UINT uUnique,LPSTR lpTempFileName)

{
  SIZE_T *string;
  char cVar1;
  long lVar2;
  uint uVar3;
  undefined8 _Dst;
  DWORD DVar4;
  DWORD DVar5;
  BOOL BVar6;
  errno_t eVar7;
  void *pvVar8;
  time_t tVar9;
  size_t sVar10;
  int *piVar11;
  DWORD *pDVar12;
  undefined1 *hObject;
  USHORT UVar13;
  short sVar14;
  ulong count;
  long in_FS_OFFSET;
  bool bVar15;
  undefined1 local_b8 [8];
  PathCharString file_templatePS;
  PathCharString full_namePS;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  string = &file_templatePS.m_count;
  file_templatePS._32_8_ = local_b8;
  file_templatePS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012677e;
  pvVar8 = pthread_getspecific(CorUnix::thObjKey);
  if (pvVar8 == (void *)0x0) {
    CreateCurrentThreadData();
  }
  if (IsInitialized == '\0') {
    tVar9 = time((time_t *)0x0);
    uUniqueSeed = 1;
    if ((USHORT)tVar9 != 0) {
      uUniqueSeed = (USHORT)tVar9;
    }
    IsInitialized = '\x01';
  }
  if ((lpPathName == (LPCSTR)0x0) || (*lpPathName == '\0')) {
    piVar11 = __errno_location();
    *piVar11 = 0x10b;
LAB_001263b0:
    uUnique = 0;
  }
  else {
    if (lpTempFileName == (LPSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012677e;
      piVar11 = __errno_location();
      *piVar11 = 0x57;
      goto LAB_001263b0;
    }
    sVar10 = strlen(lpPathName);
    if (sVar10 - 0x3f5 < 0xfffffffffffffc00) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012677e;
      piVar11 = __errno_location();
      *piVar11 = 0xce;
      goto LAB_001263b0;
    }
    count = (ulong)((int)sVar10 + 0x15);
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_b8,count);
    _Dst = file_templatePS._32_8_;
    if (file_templatePS._32_8_ == 0) {
      pDVar12 = (DWORD *)__errno_location();
LAB_0012659b:
      *pDVar12 = 8;
      goto LAB_001263b0;
    }
    *(undefined1 *)file_templatePS._32_8_ = 0;
    strcat_s((char *)_Dst,(size_t)file_templatePS.m_buffer,lpPathName);
    if (count < file_templatePS.m_size) {
      file_templatePS.m_size = count;
    }
    *(undefined1 *)(file_templatePS._32_8_ + file_templatePS.m_size) = 0;
    sVar10 = strlen((char *)_Dst);
    cVar1 = *(char *)(_Dst + -1 + sVar10);
    if ((cVar1 != '/') && (cVar1 != '\\')) {
      strcat_s((char *)_Dst,(size_t)file_templatePS.m_buffer,"\\");
    }
    if (lpPrefixString != (LPCSTR)0x0) {
      strncat_s((char *)_Dst,(size_t)file_templatePS.m_buffer,lpPrefixString,3);
    }
    FILEDosToUnixPathA((LPSTR)_Dst);
    strncat_s((char *)_Dst,(size_t)file_templatePS.m_buffer,"%.4x.TMP",8);
    DVar4 = GetLastError();
    pDVar12 = (DWORD *)__errno_location();
    *pDVar12 = 0;
    sVar10 = strlen((char *)_Dst);
    StackString<32UL,_char>::Resize
              ((StackString<32UL,_char> *)&file_templatePS.m_count,(long)((int)sVar10 + 0xb));
    if (string == (SIZE_T *)0x0) goto LAB_0012659b;
    uVar3 = (uint)uUniqueSeed;
    if (uUnique != 0) {
      uVar3 = uUnique;
    }
    sprintf_s((char *)string,(size_t)full_namePS.m_buffer,(char *)_Dst,(ulong)uVar3);
    file_templatePS.m_count._0_1_ = 0;
    hObject = (undefined1 *)
              CreateFileA((LPCSTR)string,0x40000000,1,(LPSECURITY_ATTRIBUTES)0x0,1,0,(HANDLE)0x0);
    if (uUnique == 0) {
      sVar14 = -1;
      while( true ) {
        DVar5 = GetLastError();
        if (((DVar5 == 3) || (hObject != &DAT_ffffffffffffffff)) || (sVar14 == 0)) break;
        UVar13 = uUniqueSeed + 2;
        uUniqueSeed = uUniqueSeed + 1;
        if (uUniqueSeed == 0) {
          uUniqueSeed = UVar13;
        }
        *pDVar12 = 0;
        sprintf_s((char *)string,(size_t)full_namePS.m_buffer,(char *)_Dst);
        hObject = (undefined1 *)
                  CreateFileA((LPCSTR)string,0x40000000,1,(LPSECURITY_ATTRIBUTES)0x0,1,0,(HANDLE)0x0
                             );
        sVar14 = sVar14 + -1;
      }
      bVar15 = sVar14 == 0;
    }
    else {
      bVar15 = false;
    }
    DVar5 = GetLastError();
    if (DVar5 == 0) {
      *pDVar12 = DVar4;
    }
    if (hObject == &DAT_ffffffffffffffff) {
      if (bVar15) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012677e;
        *pDVar12 = 0x50;
        goto LAB_001263b0;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012677e;
      DVar4 = GetLastError();
      uUnique = 0;
      if (DVar4 == 3) {
        *pDVar12 = 0x10b;
      }
    }
    else {
      UVar13 = uUniqueSeed;
      if (uUnique == 0) {
        uUnique = (UINT)uUniqueSeed;
        UVar13 = uUniqueSeed + 1;
        if ((USHORT)(uUniqueSeed + 1) == 0) {
          UVar13 = uUniqueSeed + 2;
        }
      }
      uUniqueSeed = UVar13;
      BVar6 = CloseHandle(hObject);
      if (BVar6 == 0) {
        fprintf(_stderr,"] %s %s:%d","GetTempFileNameA",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0xe24);
        uUnique = 0;
        fprintf(_stderr,"Unable to close the handle %p\n",hObject);
        *pDVar12 = 0x54f;
        *lpTempFileName = '\0';
      }
      else {
        eVar7 = strcpy_s(lpTempFileName,0x400,(char *)string);
        if (eVar7 != 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012677e;
          *pDVar12 = 0xce;
          *lpTempFileName = '\0';
          goto LAB_001263b0;
        }
      }
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&file_templatePS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return uUnique;
    }
    __stack_chk_fail();
  }
LAB_0012677e:
  abort();
}

Assistant:

UINT
PALAPI
GetTempFileNameA(
                 IN LPCSTR lpPathName,
                 IN LPCSTR lpPrefixString,
                 IN UINT   uUnique,
                 OUT LPSTR lpTempFileName)
{
    CPalThread *pThread;
    CHAR * full_name;
    PathCharString full_namePS;
    int length;
    CHAR * file_template;
    PathCharString file_templatePS;
    CHAR    chLastPathNameChar;
 
    HANDLE  hTempFile;
    UINT    uRet = 0;
    DWORD   dwError;
    USHORT  uLoopCounter = 0;

    PERF_ENTRY(GetTempFileNameA);
    ENTRY("GetTempFileNameA(lpPathName=%p (%s), lpPrefixString=%p (%s), uUnique=%u, " 
          "lpTempFileName=%p)\n",  lpPathName?lpPathName:"NULL",  lpPathName?lpPathName:"NULL", 
        lpPrefixString?lpPrefixString:"NULL", 
        lpPrefixString?lpPrefixString:"NULL", uUnique, 
        lpTempFileName?lpTempFileName:"NULL");

    pThread = InternalGetCurrentThread();
    if ( !IsInitialized )
    {
        uUniqueSeed = (USHORT)( time( NULL ) );
    
        /* On the off chance 0 is returned.
        0 being the error return code.  */
        ENSURE_UNIQUE_NOT_ZERO
        IsInitialized = TRUE;
    }

    if ( !lpPathName || *lpPathName == '\0' )
    {
       pThread->SetLastError( ERROR_DIRECTORY );
       goto done;
    }

    if ( NULL == lpTempFileName )  
    {
        ERROR( "lpTempFileName cannot be NULL\n" );
        pThread->SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    if ( strlen( lpPathName ) + MAX_SEEDSIZE + MAX_PREFIX >= MAX_LONGPATH ) 
    {
        WARN( "File names larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH );
        pThread->SetLastError( ERROR_FILENAME_EXCED_RANGE );
        goto done;
    }

    length = strlen(lpPathName) + MAX_SEEDSIZE + MAX_PREFIX + 10;
    file_template = file_templatePS.OpenStringBuffer(length);
    if (NULL == file_template)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    *file_template = '\0';
    strcat_s( file_template, file_templatePS.GetSizeOf(), lpPathName );
    file_templatePS.CloseBuffer(length);

    chLastPathNameChar = file_template[strlen(file_template)-1];
    if (chLastPathNameChar != '\\' && chLastPathNameChar != '/')
    {
        strcat_s( file_template, file_templatePS.GetSizeOf(), "\\" );
    }
    
    if ( lpPrefixString )
    {
        strncat_s( file_template, file_templatePS.GetSizeOf(), lpPrefixString, MAX_PREFIX );
    }
    FILEDosToUnixPathA( file_template );
    strncat_s( file_template, file_templatePS.GetSizeOf(), "%.4x.TMP", MAX_SEEDSIZE );

    /* Create the file. */
    dwError = GetLastError();
    pThread->SetLastError( NOERROR );

    length = strlen(file_template) + MAX_SEEDSIZE + MAX_PREFIX;
    full_name = full_namePS.OpenStringBuffer(length);
    if (NULL == full_name)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    sprintf_s( full_name, full_namePS.GetSizeOf(), file_template, (0 == uUnique) ? uUniqueSeed : uUnique);
    full_namePS.CloseBuffer(length);
    
    hTempFile = CreateFileA( full_name, GENERIC_WRITE, 
                             FILE_SHARE_READ, NULL, CREATE_NEW, 0, NULL );
    
    if (uUnique == 0)
    {
        /* The USHORT will overflow back to 0 if we go past
        65536 files, so break the loop after 65536 iterations.
        If the CreateFile call was not successful within that 
        number of iterations, then there are no temp file names
        left for that directory. */
        while ( ERROR_PATH_NOT_FOUND != GetLastError() && 
                INVALID_HANDLE_VALUE == hTempFile && uLoopCounter < 0xFFFF )
        {
            uUniqueSeed++;
            ENSURE_UNIQUE_NOT_ZERO;

            pThread->SetLastError( NOERROR );
            sprintf_s( full_name, full_namePS.GetSizeOf(), file_template, uUniqueSeed );
            hTempFile = CreateFileA( full_name, GENERIC_WRITE, 
                                    FILE_SHARE_READ, NULL, CREATE_NEW, 0, NULL );
            uLoopCounter++;
        
        }
    }

    /* Reset the error code.*/
    if ( NOERROR == GetLastError() )
    {
        pThread->SetLastError( dwError );
    }

    /* Windows sets ERROR_FILE_EXISTS,if there
    are no available temp files. */
    if ( INVALID_HANDLE_VALUE != hTempFile )
    {
        if (0 == uUnique)
        {
            uRet = uUniqueSeed;
            uUniqueSeed++;
            ENSURE_UNIQUE_NOT_ZERO;
        }
        else
        {
            uRet = uUnique;
        }
        
        if ( CloseHandle( hTempFile ) )
        {
            if (strcpy_s( lpTempFileName, MAX_LONGPATH, full_name ) != SAFECRT_SUCCESS)
            {
                ERROR( "strcpy_s failed!\n");
                pThread->SetLastError( ERROR_FILENAME_EXCED_RANGE );
                *lpTempFileName = '\0';
                uRet = 0;
            }
        }
        else  
        {
            ASSERT( "Unable to close the handle %p\n", hTempFile );
            pThread->SetLastError( ERROR_INTERNAL_ERROR );
            *lpTempFileName = '\0';
            uRet = 0;
        }
    }
    else if ( INVALID_HANDLE_VALUE == hTempFile && uLoopCounter < 0xFFFF )
    {
        ERROR( "Unable to create temp file. \n" );
        uRet = 0;
        
        if ( ERROR_PATH_NOT_FOUND == GetLastError() )
        {
            /* CreateFile failed because it could not 
            find the path. */
            pThread->SetLastError( ERROR_DIRECTORY );
        } /* else use the lasterror value from CreateFileA */
    }
    else
    {
        TRACE( "65535 files already exist in the directory. "
               "No temp files available for creation.\n" );
        pThread->SetLastError( ERROR_FILE_EXISTS );
    }

done:
    LOGEXIT("GetTempFileNameA returns UINT %u\n", uRet);
    PERF_EXIT(GetTempFileNameA);
    return uRet;
       
}